

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O2

BinaryOperatorTypes *
soul::TypeRules::getTypesForBitwiseOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  bool bVar1;
  ArraySize AVar2;
  ArraySize AVar3;
  Type vecType;
  Type local_40;
  PrimitiveType local_24;
  
  if (a->isRef == true) {
    Type::removeReference(&vecType,a);
    getTypesForBitwiseOp(__return_storage_ptr__,&vecType,b);
  }
  else if (b->isRef == true) {
    Type::removeReference(&vecType,b);
    getTypesForBitwiseOp(__return_storage_ptr__,a,&vecType);
  }
  else {
    if ((a->category & ~primitive) == wrap) {
      vecType.category = primitive;
      vecType.arrayElementCategory = invalid;
      vecType.isRef = false;
      vecType.isConstant = false;
      vecType.primitiveType.type = int32;
      vecType.boundingSize = 0;
      vecType.arrayElementBoundingSize = 0;
      vecType.structure.object = (Structure *)0x0;
      Type::removeReferenceIfPresent(&local_40,b);
      getTypesForBitwiseOp(__return_storage_ptr__,&vecType,&local_40);
    }
    else {
      if ((b->category & ~primitive) != wrap) {
        bVar1 = isTypeSuitableForBitwiseOp(a);
        if ((bVar1) && (bVar1 = isTypeSuitableForBitwiseOp(b), bVar1)) {
          AVar2 = Type::getVectorSize(a);
          AVar3 = Type::getVectorSize(b);
          if ((AVar2 == AVar3) && ((b->category == vector) == (a->category == vector))) {
            local_24.type =
                 ((b->primitiveType).type == int64 || (a->primitiveType).type == int64) + int32;
            if (a->category != vector) {
              (__return_storage_ptr__->resultType).category = primitive;
              (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
              (__return_storage_ptr__->resultType).isRef = false;
              (__return_storage_ptr__->resultType).isConstant = false;
              (__return_storage_ptr__->resultType).primitiveType.type = local_24.type;
              (__return_storage_ptr__->resultType).boundingSize = 0;
              (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
              (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
              (__return_storage_ptr__->operandType).category = primitive;
              (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
              (__return_storage_ptr__->operandType).isRef = false;
              (__return_storage_ptr__->operandType).isConstant = false;
              (__return_storage_ptr__->operandType).primitiveType.type = local_24.type;
              (__return_storage_ptr__->operandType).boundingSize = 0;
              (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
              (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
              return __return_storage_ptr__;
            }
            AVar2 = Type::getVectorSize(a);
            Type::createVector(&vecType,&local_24,AVar2);
            Type::Type(&__return_storage_ptr__->resultType,&vecType);
            Type::Type(&__return_storage_ptr__->operandType,&vecType);
            goto LAB_002305a2;
          }
        }
        (__return_storage_ptr__->operandType).boundingSize = 0;
        (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->operandType).category = invalid;
        (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
        (__return_storage_ptr__->operandType).isRef = false;
        (__return_storage_ptr__->operandType).isConstant = false;
        (__return_storage_ptr__->operandType).primitiveType = invalid;
        (__return_storage_ptr__->resultType).category = invalid;
        (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
        (__return_storage_ptr__->resultType).isRef = false;
        (__return_storage_ptr__->resultType).isConstant = false;
        (__return_storage_ptr__->resultType).primitiveType = invalid;
        (__return_storage_ptr__->resultType).boundingSize = 0;
        (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
        return __return_storage_ptr__;
      }
      Type::removeReferenceIfPresent(&vecType,a);
      local_40.category = primitive;
      local_40.arrayElementCategory = invalid;
      local_40.isRef = false;
      local_40.isConstant = false;
      local_40.primitiveType.type = int32;
      local_40.boundingSize = 0;
      local_40.arrayElementBoundingSize = 0;
      local_40.structure.object = (Structure *)0x0;
      getTypesForBitwiseOp(__return_storage_ptr__,&vecType,&local_40);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  }
LAB_002305a2:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&vecType.structure);
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForBitwiseOp (const Type& a, const Type& b)
    {
        if (a.isReference())  return getTypesForBitwiseOp (a.removeReference(), b);
        if (b.isReference())  return getTypesForBitwiseOp (a, b.removeReference());

        if (a.isBoundedInt())  return getTypesForBitwiseOp (PrimitiveType::int32, b.removeReferenceIfPresent());
        if (b.isBoundedInt())  return getTypesForBitwiseOp (a.removeReferenceIfPresent(), PrimitiveType::int32);

        if (isTypeSuitableForBitwiseOp (a)
             && isTypeSuitableForBitwiseOp (b)
             && a.getVectorSize() == b.getVectorSize()
             && a.isVector() == b.isVector())
        {
            auto intType = (a.isInteger64() || b.isInteger64()) ? PrimitiveType::int64 : PrimitiveType::int32;

            if (! a.isVector())
                return { intType, intType };

            auto vecType = Type::createVector (intType, a.getVectorSize());
            return { vecType, vecType };
        }

        return {};
    }